

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_helper.c
# Opt level: O0

uint32_t helper_stfle(CPUS390XState_conflict *env,uint64_t addr)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint64_t uVar4;
  uintptr_t unaff_retaddr;
  uint local_34;
  int local_2c;
  int i;
  int max_bytes;
  int count_bytes;
  uintptr_t ra;
  uint64_t addr_local;
  CPUS390XState_conflict *env_local;
  
  uVar1 = (((uint)env->regs[0] & 0xff) + 1) * 8;
  if ((addr & 7) == 0) {
    prepare_stfl();
    uVar2 = used_stfl_bytes + 7 & 0xfffffff8;
    local_2c = 0;
    while( true ) {
      local_34 = uVar2;
      if ((int)uVar1 < (int)uVar2) {
        local_34 = uVar1;
      }
      if ((int)local_34 <= local_2c) break;
      cpu_stb_data_ra_s390x(env,addr + (long)local_2c,(uint)stfl_bytes[local_2c],unaff_retaddr);
      local_2c = local_2c + 1;
    }
    uVar4 = deposit64(env->regs[0],0,8,(long)((int)uVar2 / 8 + -1));
    env->regs[0] = uVar4;
    uVar3 = 3;
    if ((int)uVar2 <= (int)uVar1) {
      uVar3 = 0;
    }
    return uVar3;
  }
  tcg_s390_program_interrupt_s390x(env,6,unaff_retaddr);
}

Assistant:

uint32_t HELPER(stfle)(CPUS390XState *env, uint64_t addr)
{
    const uintptr_t ra = GETPC();
    const int count_bytes = ((env->regs[0] & 0xff) + 1) * 8;
    int max_bytes;
    int i;

    if (addr & 0x7) {
        tcg_s390_program_interrupt(env, PGM_SPECIFICATION, ra);
    }

    prepare_stfl();
    max_bytes = ROUND_UP(used_stfl_bytes, 8);

    /*
     * The PoP says that doublewords beyond the highest-numbered facility
     * bit may or may not be stored.  However, existing hardware appears to
     * not store the words, and existing software depend on that.
     */
    for (i = 0; i < MIN(count_bytes, max_bytes); ++i) {
        cpu_stb_data_ra(env, addr + i, stfl_bytes[i], ra);
    }

    env->regs[0] = deposit64(env->regs[0], 0, 8, (max_bytes / 8) - 1);
    return count_bytes >= max_bytes ? 0 : 3;
}